

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_builder_sah.cpp
# Opt level: O2

Builder * embree::avx::BVH8VirtualSceneBuilderSAH(void *bvh,Scene *scene,size_t mode)

{
  int iVar1;
  int iVar2;
  long lVar3;
  BVHNBuilderSAH<8,_embree::Object> *this;
  
  lVar3 = *(long *)&(scene->super_AccelN).field_0x188;
  iVar1 = *(int *)(lVar3 + 0x350);
  iVar2 = *(int *)(lVar3 + 0x354);
  this = (BVHNBuilderSAH<8,_embree::Object> *)::operator_new(0xa8);
  BVHNBuilderSAH<8,_embree::Object>::BVHNBuilderSAH
            (this,(BVH *)bvh,scene,8,1.0,(long)iVar1,(long)iVar2,MTY_USER_GEOMETRY,false);
  return &this->super_Builder;
}

Assistant:

Builder* BVH8VirtualSceneBuilderSAH    (void* bvh, Scene* scene, size_t mode) {
      int minLeafSize = scene->device->object_accel_min_leaf_size;
      int maxLeafSize = scene->device->object_accel_max_leaf_size;
      return new BVHNBuilderSAH<8,Object>((BVH8*)bvh,scene,8,1.0f,minLeafSize,maxLeafSize,UserGeometry::geom_type);
    }